

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O0

AVLTreeNode<long_long> * __thiscall
itis::AVLTreeNode<long_long>::right_rotate(AVLTreeNode<long_long> *this)

{
  AVLTreeNode<long_long> *this_00;
  AVLTreeNode<long_long> *L;
  AVLTreeNode<long_long> *this_local;
  
  this_00 = this->left;
  this->left = this->left->right;
  this_00->right = this;
  updateValues(this);
  updateValues(this_00);
  return this_00;
}

Assistant:

AVLTreeNode<T>* AVLTreeNode<T>::right_rotate() {
    AVLTreeNode* L = left;
    left = left->right;
    L->right = this;

    this->updateValues();  // the order is important
    L->updateValues();

    return L;
  }